

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ConcurrentImageAtomicCase::iterate
          (ConcurrentImageAtomicCase *this)

{
  allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_00;
  allocator<unsigned_int> *this_01;
  value_type vVar1;
  glUseProgramFunc p_Var2;
  glGetUniformLocationFunc p_Var3;
  glUniform1uiFunc p_Var4;
  glBindBufferBaseFunc p_Var5;
  glBindBufferFunc p_Var6;
  GLint GVar7;
  bool bVar8;
  int iVar9;
  deUint32 dVar10;
  GLenum GVar11;
  RenderContext *pRVar12;
  undefined4 extraout_var;
  TestLog *pTVar13;
  MessageBuilder *pMVar14;
  TestError *this_02;
  reference value;
  GLuint *pGVar15;
  reference pvVar16;
  reference pvVar17;
  value_type local_139c;
  MessageBuilder local_11e8;
  MessageBuilder local_1068;
  MessageBuilder local_ee8;
  int local_d64;
  int local_d60;
  int logCallNdx;
  int local_d58;
  int local_d54;
  MessageBuilder local_d50;
  uint *local_bd0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_bc8;
  int local_bbc;
  iterator iStack_bb8;
  int callNdx_3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_bb0;
  int local_ba8;
  deUint32 local_ba4;
  int callNdx_2;
  deUint32 errorExpected;
  deUint32 errorDelta;
  int invalidOperationNdx;
  int valueNdx;
  int callNdx_1;
  allocator<unsigned_int> local_a09;
  undefined1 local_a08 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> chainDelta;
  undefined1 local_9e8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> valueChain;
  undefined1 local_9c8 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  intermediateResults;
  int local_828;
  int local_824;
  MessageBuilder local_820;
  int local_69c;
  undefined1 local_698 [4];
  int ndx;
  undefined1 local_518 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  int local_380;
  undefined1 local_37a;
  allocator<char> local_379;
  int callNdx;
  MessageBuilder local_358;
  GLint local_1d4;
  undefined1 local_1d0 [4];
  int deltaLocation;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> deltas;
  deUint32 sumValue;
  Functions *gl;
  ConcurrentImageAtomicCase *this_local;
  Functions *gl_00;
  
  pRVar12 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar9 = (*pRVar12->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar9);
  deltas.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = (this->m_numCalls * (this->m_numCalls + 1)) / 2;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
  generateShuffledRamp(this->m_numCalls,(vector<int,_std::allocator<int>_> *)local_40);
  pTVar13 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_1d0,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar14 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1d0,(char (*) [24])"Clearing image contents");
  tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1d0);
  p_Var2 = gl_00->useProgram;
  dVar10 = glu::ShaderProgram::getProgram(this->m_imageClearProgram);
  (*p_Var2)(dVar10);
  (*gl_00->bindImageTexture)(2,this->m_imageID,0,'\0',0,0x88b9,0x8236);
  (*gl_00->dispatchCompute)(this->m_workSize,this->m_workSize,1);
  (*gl_00->memoryBarrier)(0x20);
  GVar11 = (*gl_00->getError)();
  glu::checkError(GVar11,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0xaae);
  p_Var3 = gl_00->getUniformLocation;
  dVar10 = glu::ShaderProgram::getProgram(this->m_program);
  local_1d4 = (*p_Var3)(dVar10,"u_atomicDelta");
  pTVar13 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_358,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar14 = tcu::MessageBuilder::operator<<(&local_358,(char (*) [16])"Running shader ");
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&this->m_numCalls);
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [9])0x2c01578);
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [15])"Num groups = (");
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&this->m_workSize);
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [3])0x2a4b1eb);
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&this->m_workSize);
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [6])0x2c128c4);
  pMVar14 = tcu::MessageBuilder::operator<<
                      (pMVar14,(char (*) [56])
                               "Setting u_atomicDelta to a unique value for each call.\n");
  tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_358);
  if (local_1d4 == -1) {
    local_37a = 1;
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&callNdx,"u_atomicDelta location was -1",&local_379);
    tcu::TestError::TestError(this_02,(string *)&callNdx);
    local_37a = 0;
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  p_Var2 = gl_00->useProgram;
  dVar10 = glu::ShaderProgram::getProgram(this->m_program);
  (*p_Var2)(dVar10);
  (*gl_00->bindImageTexture)(2,this->m_imageID,0,'\0',0,0x88ba,0x8236);
  for (local_380 = 0; local_380 < this->m_numCalls; local_380 = local_380 + 1) {
    pTVar13 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)
               &result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,pTVar13,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar14 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)
                         &result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(char (*) [6])"Call ");
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_380);
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [19])": u_atomicDelta = ");
    value = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)local_40,(long)local_380);
    pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,value);
    tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder
              ((MessageBuilder *)
               &result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    GVar7 = local_1d4;
    p_Var4 = gl_00->uniform1ui;
    pGVar15 = (GLuint *)
              std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_40,(long)local_380);
    (*p_Var4)(GVar7,*pGVar15);
    p_Var5 = gl_00->bindBufferBase;
    pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&this->m_intermediateResultBuffers,(long)local_380);
    (*p_Var5)(0x90d2,1,*pvVar16);
    (*gl_00->dispatchCompute)(this->m_workSize,this->m_workSize,1);
  }
  GVar11 = (*gl_00->getError)();
  glu::checkError(GVar11,"post dispatch",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0xace);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_518);
  pTVar13 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_698,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar14 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_698,
                       (char (*) [54])"Verifying work image, it should be filled with value ");
  pMVar14 = tcu::MessageBuilder::operator<<
                      (pMVar14,(uint *)((long)&deltas.super__Vector_base<int,_std::allocator<int>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                       ));
  tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_698);
  readWorkImage(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_518);
  for (local_69c = 0; local_69c < this->m_workSize * this->m_workSize; local_69c = local_69c + 1) {
    pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_518,
                         (long)local_69c);
    if (*pvVar16 !=
        deltas.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_) {
      pTVar13 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_820,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar14 = tcu::MessageBuilder::operator<<
                          (&local_820,(char (*) [29])"Work image error, at index (");
      local_824 = local_69c % this->m_workSize;
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_824);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [3])0x2a4b1eb);
      local_828 = local_69c / this->m_workSize;
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_828);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [18])") expected value ");
      pMVar14 = tcu::MessageBuilder::operator<<
                          (pMVar14,(uint *)((long)&deltas.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4));
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [7])0x2c67b94);
      pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_518,
                           (long)local_69c);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,pvVar16);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [2])0x2b9e07b);
      pMVar14 = tcu::MessageBuilder::operator<<
                          (pMVar14,(char (*) [36])"Work image contains invalid values.");
      tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_820);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Image contents invalid");
      this_local._4_4_ = STOP;
      bVar8 = true;
      goto LAB_0217c531;
    }
  }
  pTVar13 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<
            ((MessageBuilder *)
             &intermediateResults.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pTVar13,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar14 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)
                       &intermediateResults.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (char (*) [31])"Work image contents are valid.");
  tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder
            ((MessageBuilder *)
             &intermediateResults.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar8 = false;
LAB_0217c531:
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_518);
  if (!bVar8) {
    iVar9 = this->m_numCalls;
    this_00 = (allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
              ((long)&valueChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator(this_00);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_9c8,(long)iVar9,this_00);
    std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
              ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               ((long)&valueChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    iVar9 = this->m_numCalls;
    this_01 = (allocator<unsigned_int> *)
              ((long)&chainDelta.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<unsigned_int>::allocator(this_01);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_9e8,(long)iVar9,this_01)
    ;
    std::allocator<unsigned_int>::~allocator
              ((allocator<unsigned_int> *)
               ((long)&chainDelta.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    iVar9 = this->m_numCalls;
    std::allocator<unsigned_int>::allocator(&local_a09);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a08,(long)iVar9,
               &local_a09);
    std::allocator<unsigned_int>::~allocator(&local_a09);
    pTVar13 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&valueNdx,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar14 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&valueNdx,
                         (char (*) [33])"Verifying intermediate results. ");
    tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&valueNdx);
    for (invalidOperationNdx = 0; invalidOperationNdx < this->m_numCalls;
        invalidOperationNdx = invalidOperationNdx + 1) {
      p_Var6 = gl_00->bindBuffer;
      pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&this->m_intermediateResultBuffers,(long)invalidOperationNdx);
      (*p_Var6)(0x90d2,*pvVar16);
      iVar9 = this->m_workSize;
      pvVar17 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              *)local_9c8,(long)invalidOperationNdx);
      readBuffer(gl_00,0x90d2,iVar9 * iVar9,pvVar17);
    }
    errorDelta = 0;
LAB_0217c812:
    if ((int)errorDelta < this->m_workSize) {
      for (local_ba8 = 0; local_ba8 < this->m_numCalls; local_ba8 = local_ba8 + 1) {
        pvVar17 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)local_9c8,(long)local_ba8);
        pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar17,(long)(int)errorDelta);
        vVar1 = *pvVar16;
        pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_9e8,
                             (long)local_ba8);
        *pvVar16 = vVar1;
      }
      local_bb0._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_9e8);
      iStack_bb8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_9e8);
      std::
      sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (local_bb0,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )iStack_bb8._M_current);
      for (local_bbc = 0; local_bbc < this->m_numCalls; local_bbc = local_bbc + 1) {
        if (local_bbc + 1 == this->m_numCalls) {
          local_139c = deltas.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_;
        }
        else {
          pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_9e8,
                               (long)(local_bbc + 1));
          local_139c = *pvVar16;
        }
        pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_9e8,
                             (long)local_bbc);
        vVar1 = *pvVar16;
        pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a08,
                             (long)local_bbc);
        *pvVar16 = local_139c - vVar1;
      }
      local_bc8._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a08);
      local_bd0 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     local_a08);
      std::
      sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (local_bc8,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )local_bd0);
      bVar8 = validateSortedAtomicRampAdditionValueChain
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_9e8,
                         deltas.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_,(int *)&errorExpected,
                         (deUint32 *)&callNdx_2,&local_ba4);
      if (bVar8) goto LAB_0217ce9c;
      pTVar13 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_d50,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar14 = tcu::MessageBuilder::operator<<
                          (&local_d50,(char (*) [38])"Intermediate buffer error, at index (");
      local_d54 = (int)errorDelta % this->m_workSize;
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_d54);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [3])0x2a4b1eb);
      local_d58 = (int)errorDelta / this->m_workSize;
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_d58);
      pMVar14 = tcu::MessageBuilder::operator<<
                          (pMVar14,(char (*) [28])"), applied operation index ");
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(int *)&errorExpected);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [26])", value was increased by ");
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(uint *)&callNdx_2);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [16])", but expected ");
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_ba4);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [3])0x2c89945);
      pMVar14 = tcu::MessageBuilder::operator<<
                          (pMVar14,(char (*) [63])
                                   "Intermediate buffer contains invalid values. Values at index (")
      ;
      logCallNdx = (int)errorDelta % this->m_workSize;
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&logCallNdx);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [3])0x2a4b1eb);
      local_d60 = (int)errorDelta / this->m_workSize;
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_d60);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [3])0x2c2d560);
      tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_d50);
      for (local_d64 = 0; local_d64 < this->m_numCalls; local_d64 = local_d64 + 1) {
        pTVar13 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_ee8,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar14 = tcu::MessageBuilder::operator<<(&local_ee8,(char (*) [7])"Value[");
        pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_d64);
        pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [5])0x2bcb658);
        pvVar17 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)local_9c8,(long)local_d64);
        pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar17,(long)(int)errorDelta);
        pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,pvVar16);
        tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_ee8);
      }
      pTVar13 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1068,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar14 = tcu::MessageBuilder::operator<<(&local_1068,(char (*) [10])0x2aa3d34);
      pMVar14 = tcu::MessageBuilder::operator<<
                          (pMVar14,(uint *)((long)&deltas.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4));
      tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1068);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Buffer contents invalid");
      this_local._4_4_ = STOP;
      bVar8 = true;
    }
    else {
      pTVar13 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_11e8,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar14 = tcu::MessageBuilder::operator<<
                          (&local_11e8,(char (*) [32])"Intermediate buffers are valid.");
      tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_11e8);
      bVar8 = false;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a08);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_9e8);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_9c8);
    if (!bVar8) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      this_local._4_4_ = STOP;
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  return this_local._4_4_;
LAB_0217ce9c:
  errorDelta = errorDelta + 1;
  goto LAB_0217c812;
}

Assistant:

TestCase::IterateResult ConcurrentImageAtomicCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const deUint32			sumValue		= (deUint32)(m_numCalls * (m_numCalls + 1) / 2);
	std::vector<int>		deltas;

	// generate unique deltas
	generateShuffledRamp(m_numCalls, deltas);

	// clear image
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Clearing image contents" << tcu::TestLog::EndMessage;

		gl.useProgram(m_imageClearProgram->getProgram());
		gl.bindImageTexture(2, m_imageID, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_R32UI);
		gl.dispatchCompute(m_workSize, m_workSize, 1);
		gl.memoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

		GLU_EXPECT_NO_ERROR(gl.getError(), "clear");
	}

	// invoke program N times, each with a different delta
	{
		const int deltaLocation = gl.getUniformLocation(m_program->getProgram(), "u_atomicDelta");

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Running shader " << m_numCalls << " times.\n"
			<< "Num groups = (" << m_workSize << ", " << m_workSize << ", 1)\n"
			<< "Setting u_atomicDelta to a unique value for each call.\n"
			<< tcu::TestLog::EndMessage;

		if (deltaLocation == -1)
			throw tcu::TestError("u_atomicDelta location was -1");

		gl.useProgram(m_program->getProgram());
		gl.bindImageTexture(2, m_imageID, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);

		for (int callNdx = 0; callNdx < m_numCalls; ++callNdx)
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Call " << callNdx << ": u_atomicDelta = " << deltas[callNdx]
				<< tcu::TestLog::EndMessage;

			gl.uniform1ui(deltaLocation, deltas[callNdx]);
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_intermediateResultBuffers[callNdx]);
			gl.dispatchCompute(m_workSize, m_workSize, 1);
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "post dispatch");
	}

	// Verify result
	{
		std::vector<deUint32> result;

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying work image, it should be filled with value " << sumValue << tcu::TestLog::EndMessage;

		readWorkImage(result);

		for (int ndx = 0; ndx < m_workSize * m_workSize; ++ndx)
		{
			if (result[ndx] != sumValue)
			{
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Work image error, at index (" << ndx % m_workSize << ", " << ndx / m_workSize << ") expected value " << (sumValue) << ", got " << result[ndx] << "\n"
					<< "Work image contains invalid values."
					<< tcu::TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image contents invalid");
				return STOP;
			}
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Work image contents are valid." << tcu::TestLog::EndMessage;
	}

	// verify steps
	{
		std::vector<std::vector<deUint32> >	intermediateResults	(m_numCalls);
		std::vector<deUint32>				valueChain			(m_numCalls);
		std::vector<deUint32>				chainDelta			(m_numCalls);

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying intermediate results. " << tcu::TestLog::EndMessage;

		// collect results

		for (int callNdx = 0; callNdx < m_numCalls; ++callNdx)
		{
			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_intermediateResultBuffers[callNdx]);
			readBuffer(gl, GL_SHADER_STORAGE_BUFFER, m_workSize * m_workSize, intermediateResults[callNdx]);
		}

		// verify values

		for (int valueNdx = 0; valueNdx < m_workSize; ++valueNdx)
		{
			int			invalidOperationNdx;
			deUint32	errorDelta;
			deUint32	errorExpected;

			// collect result chain for each element
			for (int callNdx = 0; callNdx < m_numCalls; ++callNdx)
				valueChain[callNdx] = intermediateResults[callNdx][valueNdx];

			// check there exists a path from 0 to sumValue using each addition once
			// decompose cumulative results to addition operations (all additions positive => this works)

			std::sort(valueChain.begin(), valueChain.end());

			for (int callNdx = 0; callNdx < m_numCalls; ++callNdx)
				chainDelta[callNdx] = ((callNdx + 1 == m_numCalls) ? (sumValue) : (valueChain[callNdx+1])) - valueChain[callNdx];

			// chainDelta contains now the actual additions applied to the value
			std::sort(chainDelta.begin(), chainDelta.end());

			// validate chain
			if (!validateSortedAtomicRampAdditionValueChain(valueChain, sumValue, invalidOperationNdx, errorDelta, errorExpected))
			{
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Intermediate buffer error, at index (" << valueNdx % m_workSize << ", " << valueNdx / m_workSize << "), applied operation index "
					<< invalidOperationNdx << ", value was increased by " << errorDelta << ", but expected " << errorExpected << ".\n"
					<< "Intermediate buffer contains invalid values. Values at index (" << valueNdx % m_workSize << ", " << valueNdx / m_workSize << ")\n"
					<< tcu::TestLog::EndMessage;

				for (int logCallNdx = 0; logCallNdx < m_numCalls; ++logCallNdx)
					m_testCtx.getLog() << tcu::TestLog::Message << "Value[" << logCallNdx << "] = " << intermediateResults[logCallNdx][valueNdx] << tcu::TestLog::EndMessage;
				m_testCtx.getLog() << tcu::TestLog::Message << "Result = " << sumValue << tcu::TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Buffer contents invalid");
				return STOP;
			}
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Intermediate buffers are valid." << tcu::TestLog::EndMessage;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}